

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::PhpName
                   (string *__return_storage_ptr__,string *full_name,bool is_descriptor)

{
  char cVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)CONCAT71(in_register_00000011,is_descriptor) == 0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (full_name->_M_string_length != 0) {
      uVar2 = 0;
      do {
        cVar1 = (full_name->_M_dataplus)._M_p[uVar2];
        if ((cVar1 < 'a') && (cVar1 == '.')) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < full_name->_M_string_length);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p,
               kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p +
               kDescriptorPackageName_abi_cxx11_._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpName(const std::string& full_name, bool is_descriptor) {
  if (is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      result += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += '\\';
      cap_next_letter = true;
    } else {
      result += full_name[i];
      cap_next_letter = false;
    }
  }
  return result;
}